

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

unique_ptr<wasm_externtype_t,_std::default_delete<wasm_externtype_t>_> __thiscall
wasm_externtype_t::New
          (wasm_externtype_t *this,
          unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> *ptr)

{
  FuncType *args;
  undefined8 uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  _func_int **local_20;
  
  args = (FuncType *)
         (ptr->_M_t).
         super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
         ._M_t.
         super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
         .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl;
  switch(*(ExternKind *)((long)&args->super_ExternType + 8)) {
  case First:
    wabt::MakeUnique<wasm_functype_t,wabt::interp::FuncType&>((wabt *)&local_20,args);
    break;
  case Table:
    wabt::MakeUnique<wasm_tabletype_t,wabt::interp::TableType&>((wabt *)&local_20,(TableType *)args)
    ;
    break;
  case Memory:
    wabt::MakeUnique<wasm_memorytype_t,wabt::interp::MemoryType&>
              ((wabt *)&local_20,(MemoryType *)args);
    break;
  case Global:
    pp_Var2 = (_func_int **)operator_new(0x18);
    uVar1 = *(undefined8 *)((long)&args->super_ExternType + 0xc);
    p_Var3 = (_func_int *)operator_new(0x18);
    *(undefined4 *)(p_Var3 + 8) = 3;
    *(undefined ***)p_Var3 = &PTR__ExternType_001eb960;
    *(undefined8 *)(p_Var3 + 0xc) = uVar1;
    pp_Var2[1] = p_Var3;
    *pp_Var2 = (_func_int *)&PTR__wasm_externtype_t_001ebc50;
    *(int *)(pp_Var2 + 2) = (int)uVar1;
    this->_vptr_wasm_externtype_t = pp_Var2;
    return (unique_ptr<wasm_externtype_t,_std::default_delete<wasm_externtype_t>_>)this;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0xc0,
                  "static std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(std::unique_ptr<ExternType>)"
                 );
  }
  this->_vptr_wasm_externtype_t = local_20;
  return (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         (__uniq_ptr_data<wasm_externtype_t,_std::default_delete<wasm_externtype_t>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<wasm_externtype_t> wasm_externtype_t::New(
    std::unique_ptr<ExternType> ptr) {
  switch (ptr->kind) {
    case ExternKind::Func:
      return MakeUnique<wasm_functype_t>(*cast<FuncType>(ptr.get()));

    case ExternKind::Table:
      return MakeUnique<wasm_tabletype_t>(*cast<TableType>(ptr.get()));

    case ExternKind::Memory:
      return MakeUnique<wasm_memorytype_t>(*cast<MemoryType>(ptr.get()));

    case ExternKind::Global:
      return MakeUnique<wasm_globaltype_t>(*cast<GlobalType>(ptr.get()));

    case ExternKind::Event:
      break;
  }

  assert(false);
  return {};
}